

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

size_t __thiscall
anon_unknown.dwarf_3cc2557::root_dir_start
          (anon_unknown_dwarf_3cc2557 *this,StringRef str,Style style)

{
  char cVar1;
  char cVar2;
  size_type sVar3;
  int iVar4;
  char *Str;
  StringRef local_40;
  undefined1 local_30 [8];
  StringRef str_local;
  
  str_local.Data = str.Data;
  iVar4 = (int)str.Length;
  local_30 = (undefined1  [8])this;
  if (((iVar4 == 0) && ((char *)0x2 < str_local.Data)) &&
     (cVar1 = llvm::StringRef::operator[]((StringRef *)local_30,1), cVar1 == ':')) {
    cVar1 = llvm::StringRef::operator[]((StringRef *)local_30,2);
    if (cVar1 == '/') {
      return 2;
    }
    if (cVar1 == '\\') {
      return 2;
    }
  }
  if ((char *)0x3 < str_local.Data) {
    cVar1 = llvm::StringRef::operator[]((StringRef *)local_30,0);
    if ((cVar1 == '/') || (iVar4 == 0 && cVar1 == '\\')) {
      cVar1 = llvm::StringRef::operator[]((StringRef *)local_30,0);
      cVar2 = llvm::StringRef::operator[]((StringRef *)local_30,1);
      if (cVar1 == cVar2) {
        cVar1 = llvm::StringRef::operator[]((StringRef *)local_30,2);
        if ((cVar1 != '/') && (iVar4 != 0 || cVar1 != '\\')) {
          Str = "/";
          if (iVar4 == 0) {
            Str = "\\/";
          }
          llvm::StringRef::StringRef(&local_40,Str);
          sVar3 = llvm::StringRef::find_first_of((StringRef *)local_30,local_40,2);
          return sVar3;
        }
      }
    }
  }
  if (str_local.Data != (char *)0x0) {
    cVar1 = llvm::StringRef::operator[]((StringRef *)local_30,0);
    if (cVar1 == '/') {
      return 0;
    }
    if (iVar4 == 0 && cVar1 == '\\') {
      return 0;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t root_dir_start(StringRef str, Style style) {
    // case "c:/"
    if (real_style(style) == Style::windows) {
      if (str.size() > 2 && str[1] == ':' && is_separator(str[2], style))
        return 2;
    }

    // case "//net"
    if (str.size() > 3 && is_separator(str[0], style) && str[0] == str[1] &&
        !is_separator(str[2], style)) {
      return str.find_first_of(separators(style), 2);
    }

    // case "/"
    if (str.size() > 0 && is_separator(str[0], style))
      return 0;

    return StringRef::npos;
  }